

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-handle-allocator.cc
# Opt level: O2

void handle_allocator_test(void)

{
  uint uVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  ulong uVar2;
  int iVar3;
  size_t i;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> perm_handles;
  vector<unsigned_long,_std::allocator<unsigned_long>_> handles;
  HandleAllocator<unsigned_long> allocator;
  uint64_t handle_1;
  random_device seed_gen;
  mt19937 engine;
  
  std::random_device::random_device(&seed_gen);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&engine,(ulong)uVar1);
  perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  allocator.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  allocator.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  allocator.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  allocator.counter_ = 1;
  allocator.dirty_ = true;
  lVar4 = 0x4000;
  iVar3 = 1;
  while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
    bVar7 = tinyusdz::HandleAllocator<unsigned_long>::Allocate(&allocator,(unsigned_long *)&handles)
    ;
    if (!bVar7) {
      iVar3 = 0;
      break;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&perm_handles,(value_type_conflict1 *)&handles);
  }
  acutest_check_(iVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x27,"%s","ok");
  acutest_check_((uint)(((long)allocator.freeList_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)allocator.freeList_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) - allocator.counter_
                       == -0x4001),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x28,"%s","allocator.Size() == n");
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish,&engine);
  uVar5 = 0;
  do {
    uVar2 = uVar5;
    uVar6 = (long)perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar6 <= uVar2) break;
    bVar7 = tinyusdz::HandleAllocator<unsigned_long>::Has
                      (&allocator,
                       perm_handles.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar2]);
    uVar5 = uVar2 + 1;
  } while (bVar7);
  acutest_check_((uint)(uVar6 <= uVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x35,"%s","ok");
  uVar5 = 0;
  do {
    uVar2 = uVar5;
    uVar6 = (long)perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar6 <= uVar2) break;
    bVar7 = tinyusdz::HandleAllocator<unsigned_long>::Release
                      (&allocator,
                       perm_handles.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar2]);
    uVar5 = uVar2 + 1;
  } while (bVar7);
  acutest_check_((uint)(uVar6 <= uVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x41,"%s","ok");
  acutest_check_((uint)(allocator.counter_ ==
                       ((long)allocator.freeList_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)allocator.freeList_.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) + 1U),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x43,"%s","allocator.Size() == 0");
  uVar5 = 0;
  do {
    uVar2 = uVar5;
    uVar6 = (long)perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    if (uVar6 <= uVar2) break;
    bVar7 = tinyusdz::HandleAllocator<unsigned_long>::Has
                      (&allocator,
                       perm_handles.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar2]);
    uVar5 = uVar2 + 1;
  } while (!bVar7);
  acutest_check_((uint)(uVar6 <= uVar2),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x4e,"%s","ok");
  handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = 0;
  iVar3 = 1;
  do {
    if ((ulong)((long)perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar5) {
LAB_001145c5:
      acutest_check_(iVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                     ,0x5b,"%s","ok");
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      acutest_check_((uint)(*handles.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start == 1),
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                     ,0x5f,"%s","handles.front() == 1");
      acutest_check_((uint)(handles.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1] == 0x4000),
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                     ,0x61,"%s","last == n");
      __first = std::
                __unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                          (handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                (&handles,(const_iterator)__first._M_current,
                 (const_iterator)
                 handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      acutest_check_((uint)((long)handles.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)handles.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start ==
                           (long)perm_handles.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)perm_handles.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start),
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                     ,99,"%s","handles.size() == perm_handles.size()");
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&allocator);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&perm_handles.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::random_device::~random_device(&seed_gen);
      return;
    }
    bVar7 = tinyusdz::HandleAllocator<unsigned_long>::Allocate(&allocator,&handle_1);
    if (!bVar7) {
      iVar3 = 0;
      goto LAB_001145c5;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&handles,&handle_1);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void handle_allocator_test(void) {

  std::random_device seed_gen;
  std::mt19937 engine(seed_gen());

  uint64_t n = 1024*16;

  std::vector<uint64_t> perm_handles;

  HandleAllocator<uint64_t> allocator;

  bool ok = true;
  for (size_t i = 0; i < n; i++) {
    uint64_t handle;
    if (!allocator.Allocate(&handle)) {
      ok = false;
      break; 
    }

    perm_handles.push_back(handle);
  }
  TEST_CHECK(ok);
  TEST_CHECK(allocator.Size() == n);

  std::shuffle(perm_handles.begin(), perm_handles.end(), engine);

  // handle should exist
  ok = true;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    //std::cout << "handle = " << perm_handles[i] << ", Size = " << allocator.Size() << "\n";
    if (!allocator.Has(perm_handles[i])) {
      ok = false;
      break;
    }
  }
  TEST_CHECK(ok);

  //std::cout << "del \n";
  // delete
  ok = true;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    //std::cout << "del handle " << perm_handles[i] << ", Size = " << allocator.Size() << "\n";
    if (!allocator.Release(perm_handles[i])) {
      ok = false;
      break;
    }
  }
  TEST_CHECK(ok);
  //std::cout << "del done\n";
  TEST_CHECK(allocator.Size() == 0);
  
  // no handle exists
  ok = true;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    //std::cout << "has handle " << perm_handles[i] << " = " << allocator.Has(perm_handles[i]) << "\n";
    if (allocator.Has(perm_handles[i])) {
      ok = false;
      break;
    }
  }
  TEST_CHECK(ok);

  // reallocate test
  ok = true;
  std::vector<uint64_t> handles;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    uint64_t handle;
    if (!allocator.Allocate(&handle)) {
      ok = false;
      break;
    }
    handles.push_back(handle);
  }
  TEST_CHECK(ok);
  // uniqueness check
  std::sort(handles.begin(), handles.end());
  // array items = [1, ..., n]
  TEST_CHECK(handles.front() == 1); 
  uint64_t &last = handles.back();
  TEST_CHECK(last == n);
  handles.erase(std::unique(handles.begin(), handles.end()), handles.end());
  TEST_CHECK(handles.size() == perm_handles.size());


}